

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isValidRegistryBasedAuthority(XMLCh *authority)

{
  short *psVar1;
  XMLCh *pXVar2;
  XMLCh theChar;
  bool bVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  
  if (authority == (XMLCh *)0x0) {
LAB_00254675:
    bVar5 = false;
  }
  else {
    bVar5 = true;
    theChar = *authority;
    while (theChar != L'\0') {
      bVar3 = XMLString::isAlphaNum(theChar);
      lVar6 = 2;
      if (((!bVar3) && (iVar4 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,theChar), iVar4 == -1))
         && (iVar4 = XMLString::indexOf((XMLCh *)REG_NAME_CHARACTERS,*authority), iVar4 == -1)) {
        if (*authority != L'%') goto LAB_00254675;
        lVar6 = 2;
        do {
          psVar1 = (short *)((long)authority + lVar6);
          lVar6 = lVar6 + 2;
        } while (*psVar1 != 0);
        if ((0xfffffffffffffffc < (lVar6 >> 1) - 4U) ||
           (bVar3 = XMLString::isHex(authority[1]), !bVar3)) goto LAB_00254675;
        bVar3 = XMLString::isHex(authority[2]);
        lVar6 = 6;
        if (!bVar3) goto LAB_00254675;
      }
      pXVar2 = (XMLCh *)((long)authority + lVar6);
      authority = (XMLCh *)((long)authority + lVar6);
      theChar = *pXVar2;
    }
  }
  return bVar5;
}

Assistant:

bool XMLUri::isValidRegistryBasedAuthority(const XMLCh* const authority)
{
    // check authority
    if (!authority)
        return false;

    const XMLCh* tmpStr = authority;
    while (*tmpStr)
    {
        if (isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(REG_NAME_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr + 1))     // 1st hex
                && XMLString::isHex(*(tmpStr + 2)))  // 2nd hex
            {
                tmpStr+=3;
            }
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}